

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall google::protobuf::TextFormat::Printer::Printer(Printer *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
  (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->initial_indent_level_ = 0;
  this->single_line_mode_ = false;
  this->use_field_number_ = false;
  this->use_short_repeated_primitives_ = false;
  this->hide_unknown_fields_ = false;
  this->print_message_fields_in_index_order_ = false;
  this->expand_any_ = false;
  this->truncate_string_field_longer_than_ = 0;
  (this->default_field_value_printer_)._M_t.
  super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  .super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>.
  _M_head_impl = (FastFieldValuePrinter *)0x0;
  (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->custom_message_printers_)._M_t._M_impl.super__Rb_tree_header;
  (this->custom_message_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->custom_message_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->custom_message_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->custom_message_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->custom_message_printers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->finder_ = (Finder *)0x0;
  SetUseUtf8StringEscaping(this,false);
  return;
}

Assistant:

TextFormat::Printer::Printer()
    : initial_indent_level_(0),
      single_line_mode_(false),
      use_field_number_(false),
      use_short_repeated_primitives_(false),
      hide_unknown_fields_(false),
      print_message_fields_in_index_order_(false),
      expand_any_(false),
      truncate_string_field_longer_than_(0LL),
      finder_(nullptr) {
  SetUseUtf8StringEscaping(false);
}